

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_dr_mp3d_synth_granule
               (float *qmf_state,float *grbuf,int nbands,int nch,ma_dr_mp3d_sample_t *pcm,
               float *lins)

{
  ma_dr_mp3d_sample_t *pcm_00;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  float *pfVar5;
  long lVar6;
  float *pfVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  float *pfVar11;
  long lVar12;
  float *pfVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  float *pfVar18;
  float *pfVar19;
  long lVar20;
  int k;
  long lVar21;
  long lVar22;
  float *pfVar23;
  long lVar24;
  undefined1 auVar25 [16];
  float fVar26;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  long local_318;
  long local_2f0;
  float *local_2e8;
  float *local_2e0;
  float *local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_288;
  long local_280;
  long local_278;
  float local_238 [2];
  undefined8 uStack_230;
  float afStack_228 [24];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  float local_1b8 [28];
  undefined8 local_148;
  undefined8 uStack_140;
  float local_138 [66];
  
  uVar8 = 0;
  uVar16 = 0;
  if (0 < nch) {
    uVar16 = (ulong)(uint)nch;
  }
  pfVar5 = grbuf + 0x10e;
  fVar26 = (float)DAT_001945e0;
  fVar30 = DAT_001945e0._4_4_;
  fVar31 = DAT_001945e0._8_4_;
  fVar32 = DAT_001945e0._12_4_;
  pfVar7 = grbuf;
  for (; uVar8 != uVar16; uVar8 = uVar8 + 1) {
    pfVar11 = pfVar5;
    pfVar23 = pfVar7;
    for (lVar21 = 0; lVar21 < nbands; lVar21 = lVar21 + 4) {
      pfVar18 = (float *)&DAT_00193778;
      pfVar13 = pfVar11;
      pfVar19 = pfVar23;
      for (lVar22 = 0; lVar22 != 0x80; lVar22 = lVar22 + 0x10) {
        fVar47 = *pfVar19 + pfVar13[0x120];
        fVar49 = pfVar19[1] + pfVar13[0x121];
        fVar50 = pfVar19[2] + pfVar13[0x122];
        fVar51 = pfVar19[3] + pfVar13[0x123];
        fVar53 = *pfVar13 + pfVar19[0x120];
        fVar55 = pfVar13[1] + pfVar19[0x121];
        fVar57 = pfVar13[2] + pfVar19[0x122];
        fVar59 = pfVar13[3] + pfVar19[0x123];
        fVar45 = pfVar18[-2];
        fVar67 = pfVar18[-1];
        fVar52 = *pfVar18;
        fVar39 = fVar45 * (*pfVar13 - pfVar19[0x120]);
        fVar41 = fVar45 * (pfVar13[1] - pfVar19[0x121]);
        fVar43 = fVar45 * (pfVar13[2] - pfVar19[0x122]);
        fVar45 = fVar45 * (pfVar13[3] - pfVar19[0x123]);
        fVar61 = fVar67 * (*pfVar19 - pfVar13[0x120]);
        fVar63 = fVar67 * (pfVar19[1] - pfVar13[0x121]);
        fVar65 = fVar67 * (pfVar19[2] - pfVar13[0x122]);
        fVar67 = fVar67 * (pfVar19[3] - pfVar13[0x123]);
        *(float *)((long)local_238 + lVar22) = fVar53 + fVar47;
        *(float *)((long)local_238 + lVar22 + 4) = fVar55 + fVar49;
        *(float *)((long)afStack_228 + lVar22 + -8) = fVar57 + fVar50;
        *(float *)((long)afStack_228 + lVar22 + -4) = fVar59 + fVar51;
        *(float *)((long)local_1b8 + lVar22) = (fVar47 - fVar53) * fVar52;
        *(float *)((long)local_1b8 + lVar22 + 4) = (fVar49 - fVar55) * fVar52;
        *(float *)((long)local_1b8 + lVar22 + 8) = (fVar50 - fVar57) * fVar52;
        *(float *)((long)local_1b8 + lVar22 + 0xc) = (fVar51 - fVar59) * fVar52;
        *(float *)((long)local_138 + lVar22) = fVar39 + fVar61;
        *(float *)((long)local_138 + lVar22 + 4) = fVar41 + fVar63;
        *(float *)((long)local_138 + lVar22 + 8) = fVar43 + fVar65;
        *(float *)((long)local_138 + lVar22 + 0xc) = fVar45 + fVar67;
        *(float *)((long)local_138 + lVar22 + 0x80) = (fVar61 - fVar39) * fVar52;
        *(float *)((long)local_138 + lVar22 + 0x84) = (fVar63 - fVar41) * fVar52;
        *(float *)((long)local_138 + lVar22 + 0x88) = (fVar65 - fVar43) * fVar52;
        *(float *)((long)local_138 + lVar22 + 0x8c) = (fVar67 - fVar45) * fVar52;
        pfVar18 = pfVar18 + 3;
        pfVar13 = pfVar13 + -0x12;
        pfVar19 = pfVar19 + 0x12;
      }
      for (lVar22 = 0; (int)lVar22 != 0x200; lVar22 = lVar22 + 0x80) {
        fVar45 = *(float *)((long)local_238 + lVar22 + 4);
        fVar67 = *(float *)((long)afStack_228 + lVar22 + -8);
        fVar52 = *(float *)((long)afStack_228 + lVar22 + -4);
        fVar39 = *(float *)((long)afStack_228 + lVar22 + 4);
        fVar41 = *(float *)((long)afStack_228 + lVar22 + 8);
        fVar43 = *(float *)((long)afStack_228 + lVar22 + 0xc);
        fVar47 = *(float *)((long)afStack_228 + lVar22 + 0x10);
        fVar49 = *(float *)((long)afStack_228 + lVar22 + 0x14);
        fVar50 = *(float *)((long)afStack_228 + lVar22 + 0x18);
        fVar51 = *(float *)((long)afStack_228 + lVar22 + 0x1c);
        fVar53 = *(float *)((long)afStack_228 + lVar22 + 0x20);
        fVar55 = *(float *)((long)afStack_228 + lVar22 + 0x24);
        fVar57 = *(float *)((long)afStack_228 + lVar22 + 0x28);
        fVar59 = *(float *)((long)afStack_228 + lVar22 + 0x2c);
        fVar61 = *(float *)((long)afStack_228 + lVar22 + 0x30);
        fVar63 = *(float *)((long)afStack_228 + lVar22 + 0x34);
        fVar65 = *(float *)((long)afStack_228 + lVar22 + 0x38);
        fVar69 = *(float *)((long)afStack_228 + lVar22 + 0x3c);
        fVar38 = *(float *)((long)afStack_228 + lVar22 + 0x40);
        fVar40 = *(float *)((long)afStack_228 + lVar22 + 0x44);
        fVar42 = *(float *)((long)afStack_228 + lVar22 + 0x48);
        fVar44 = *(float *)((long)afStack_228 + lVar22 + 0x4c);
        fVar37 = *(float *)((long)afStack_228 + lVar22 + 0x50);
        fVar33 = *(float *)((long)afStack_228 + lVar22 + 0x54);
        fVar34 = *(float *)((long)afStack_228 + lVar22 + 0x58);
        fVar35 = *(float *)((long)afStack_228 + lVar22 + 0x5c);
        fVar36 = *(float *)((long)&local_1c8 + lVar22 + 4);
        fVar46 = *(float *)((long)&uStack_1c0 + lVar22 + 4);
        fVar54 = *(float *)((long)local_238 + lVar22) - *(float *)((long)&local_1c8 + lVar22);
        fVar56 = fVar45 - fVar36;
        fVar58 = fVar67 - *(float *)((long)&uStack_1c0 + lVar22);
        fVar60 = fVar52 - fVar46;
        fVar48 = *(float *)((long)local_238 + lVar22) + *(float *)((long)&local_1c8 + lVar22);
        fVar45 = fVar45 + fVar36;
        fVar67 = fVar67 + *(float *)((long)&uStack_1c0 + lVar22);
        fVar52 = fVar52 + fVar46;
        fVar62 = *(float *)((long)afStack_228 + lVar22) - fVar37;
        fVar64 = fVar39 - fVar33;
        fVar66 = fVar41 - fVar34;
        fVar68 = fVar43 - fVar35;
        fVar37 = *(float *)((long)afStack_228 + lVar22) + fVar37;
        fVar39 = fVar39 + fVar33;
        fVar41 = fVar41 + fVar34;
        fVar43 = fVar43 + fVar35;
        fVar33 = fVar47 - fVar38;
        fVar34 = fVar49 - fVar40;
        fVar35 = fVar50 - fVar42;
        fVar36 = fVar51 - fVar44;
        fVar47 = fVar47 + fVar38;
        fVar49 = fVar49 + fVar40;
        fVar50 = fVar50 + fVar42;
        fVar51 = fVar51 + fVar44;
        fVar70 = fVar53 + fVar61;
        fVar71 = fVar55 + fVar63;
        fVar72 = fVar57 + fVar65;
        fVar73 = fVar59 + fVar69;
        fVar40 = fVar48 - fVar70;
        fVar42 = fVar45 - fVar71;
        fVar44 = fVar67 - fVar72;
        fVar46 = fVar52 - fVar73;
        fVar70 = fVar70 + fVar48;
        fVar71 = fVar71 + fVar45;
        fVar72 = fVar72 + fVar67;
        fVar73 = fVar73 + fVar52;
        fVar45 = fVar47 + fVar37;
        fVar67 = fVar49 + fVar39;
        fVar52 = fVar50 + fVar41;
        fVar38 = fVar51 + fVar43;
        *(float *)((long)local_238 + lVar22) = fVar45 + fVar70;
        *(float *)((long)local_238 + lVar22 + 4) = fVar67 + fVar71;
        *(float *)((long)afStack_228 + lVar22 + -8) = fVar52 + fVar72;
        *(float *)((long)afStack_228 + lVar22 + -4) = fVar38 + fVar73;
        *(float *)((long)afStack_228 + lVar22 + 0x30) = (fVar70 - fVar45) * 0.70710677;
        *(float *)((long)afStack_228 + lVar22 + 0x34) = (fVar71 - fVar67) * 0.70710677;
        *(float *)((long)afStack_228 + lVar22 + 0x38) = (fVar72 - fVar52) * 0.70710677;
        *(float *)((long)afStack_228 + lVar22 + 0x3c) = (fVar73 - fVar38) * 0.70710677;
        fVar45 = (fVar33 + fVar62) * 0.70710677;
        fVar67 = (fVar34 + fVar64) * 0.70710677;
        fVar52 = (fVar35 + fVar66) * 0.70710677;
        fVar38 = (fVar36 + fVar68) * 0.70710677;
        fVar62 = fVar62 + fVar54;
        fVar64 = fVar64 + fVar56;
        fVar66 = fVar66 + fVar58;
        fVar68 = fVar68 + fVar60;
        fVar53 = ((fVar53 - fVar61) + fVar33) - fVar62 * fVar26;
        fVar55 = ((fVar55 - fVar63) + fVar34) - fVar64 * fVar30;
        fVar57 = ((fVar57 - fVar65) + fVar35) - fVar66 * fVar31;
        fVar59 = ((fVar59 - fVar69) + fVar36) - fVar68 * fVar32;
        fVar62 = fVar53 * 0.38268343 + fVar62;
        fVar64 = fVar55 * 0.38268343 + fVar64;
        fVar66 = fVar57 * 0.38268343 + fVar66;
        fVar68 = fVar59 * 0.38268343 + fVar68;
        fVar61 = fVar54 - fVar45;
        fVar63 = fVar56 - fVar67;
        fVar65 = fVar58 - fVar52;
        fVar69 = fVar60 - fVar38;
        fVar45 = fVar45 + fVar54;
        fVar67 = fVar67 + fVar56;
        fVar52 = fVar52 + fVar58;
        fVar38 = fVar38 + fVar60;
        fVar53 = fVar53 - fVar62 * fVar26;
        fVar55 = fVar55 - fVar64 * fVar30;
        fVar57 = fVar57 - fVar66 * fVar31;
        fVar59 = fVar59 - fVar68 * fVar32;
        fVar47 = ((fVar37 - fVar47) + fVar40) * 0.70710677;
        fVar39 = ((fVar39 - fVar49) + fVar42) * 0.70710677;
        fVar41 = ((fVar41 - fVar50) + fVar44) * 0.70710677;
        fVar43 = ((fVar43 - fVar51) + fVar46) * 0.70710677;
        *(float *)((long)afStack_228 + lVar22) = (fVar45 + fVar62) * 0.5097956;
        *(float *)((long)afStack_228 + lVar22 + 4) = (fVar67 + fVar64) * 0.5097956;
        *(float *)((long)afStack_228 + lVar22 + 8) = (fVar52 + fVar66) * 0.5097956;
        *(float *)((long)afStack_228 + lVar22 + 0xc) = (fVar38 + fVar68) * 0.5097956;
        *(float *)((long)afStack_228 + lVar22 + 0x10) = (fVar40 + fVar47) * 0.5411961;
        *(float *)((long)afStack_228 + lVar22 + 0x14) = (fVar42 + fVar39) * 0.5411961;
        *(float *)((long)afStack_228 + lVar22 + 0x18) = (fVar44 + fVar41) * 0.5411961;
        *(float *)((long)afStack_228 + lVar22 + 0x1c) = (fVar46 + fVar43) * 0.5411961;
        *(float *)((long)afStack_228 + lVar22 + 0x20) = (fVar61 - fVar53) * 0.6013449;
        *(float *)((long)afStack_228 + lVar22 + 0x24) = (fVar63 - fVar55) * 0.6013449;
        *(float *)((long)afStack_228 + lVar22 + 0x28) = (fVar65 - fVar57) * 0.6013449;
        *(float *)((long)afStack_228 + lVar22 + 0x2c) = (fVar69 - fVar59) * 0.6013449;
        *(float *)((long)afStack_228 + lVar22 + 0x40) = (fVar61 + fVar53) * 0.8999762;
        *(float *)((long)afStack_228 + lVar22 + 0x44) = (fVar63 + fVar55) * 0.8999762;
        *(float *)((long)afStack_228 + lVar22 + 0x48) = (fVar65 + fVar57) * 0.8999762;
        *(float *)((long)afStack_228 + lVar22 + 0x4c) = (fVar69 + fVar59) * 0.8999762;
        *(float *)((long)afStack_228 + lVar22 + 0x50) = (fVar40 - fVar47) * 1.306563;
        *(float *)((long)afStack_228 + lVar22 + 0x54) = (fVar42 - fVar39) * 1.306563;
        *(float *)((long)afStack_228 + lVar22 + 0x58) = (fVar44 - fVar41) * 1.306563;
        *(float *)((long)afStack_228 + lVar22 + 0x5c) = (fVar46 - fVar43) * 1.306563;
        *(float *)((long)&local_1c8 + lVar22) = (fVar45 - fVar62) * 2.5629156;
        *(float *)((long)&local_1c8 + lVar22 + 4) = (fVar67 - fVar64) * 2.5629156;
        *(float *)((long)&uStack_1c0 + lVar22) = (fVar52 - fVar66) * 2.5629156;
        *(float *)((long)&uStack_1c0 + lVar22 + 4) = (fVar38 - fVar68) * 2.5629156;
      }
      lVar22 = 0;
      pfVar13 = local_138 + 0x24;
      if (nbands + -3 < lVar21) {
        for (; lVar22 != 0x7e0; lVar22 = lVar22 + 0x120) {
          fVar45 = pfVar13[-4];
          fVar67 = pfVar13[-3];
          fVar52 = *pfVar13;
          fVar39 = pfVar13[1];
          *(undefined8 *)((long)pfVar23 + lVar22) = *(undefined8 *)(pfVar13 + -100);
          *(ulong *)((long)pfVar23 + lVar22 + 0x48) =
               CONCAT44(pfVar13[-0x23] + fVar67 + fVar39,pfVar13[-0x24] + fVar45 + fVar52);
          *(ulong *)((long)pfVar23 + lVar22 + 0x90) =
               CONCAT44(pfVar13[-0x43] + pfVar13[-0x3f],pfVar13[-0x44] + pfVar13[-0x40]);
          *(ulong *)((long)pfVar23 + lVar22 + 0xd8) =
               CONCAT44(fVar67 + fVar39 + pfVar13[-0x1f],fVar45 + fVar52 + pfVar13[-0x20]);
          pfVar13 = pfVar13 + 4;
        }
        *(undefined8 *)(pfVar23 + 0x1f8) = local_1c8;
        *(ulong *)(pfVar23 + 0x20a) =
             CONCAT44(local_138[0x1d] + local_138[0x3d],local_138[0x1c] + local_138[0x3c]);
        *(undefined8 *)(pfVar23 + 0x21c) = local_148;
        pfVar23[0x22e] = local_138[0x3c];
        pfVar23[0x22f] = local_138[0x3d];
      }
      else {
        for (; lVar22 != 0x7e0; lVar22 = lVar22 + 0x120) {
          fVar45 = pfVar13[-4];
          fVar67 = pfVar13[-3];
          fVar52 = pfVar13[-2];
          fVar39 = pfVar13[-1];
          fVar41 = *pfVar13;
          fVar43 = pfVar13[1];
          fVar47 = pfVar13[2];
          fVar49 = pfVar13[3];
          uVar1 = *(undefined8 *)(pfVar13 + -0x62);
          *(undefined8 *)((long)pfVar23 + lVar22) = *(undefined8 *)(pfVar13 + -100);
          ((undefined8 *)((long)pfVar23 + lVar22))[1] = uVar1;
          fVar50 = pfVar13[-0x23];
          fVar51 = pfVar13[-0x22];
          fVar53 = pfVar13[-0x21];
          pfVar19 = (float *)((long)pfVar23 + lVar22 + 0x48);
          *pfVar19 = pfVar13[-0x24] + fVar45 + fVar41;
          pfVar19[1] = fVar50 + fVar67 + fVar43;
          pfVar19[2] = fVar51 + fVar52 + fVar47;
          pfVar19[3] = fVar53 + fVar39 + fVar49;
          fVar50 = pfVar13[-0x43];
          fVar51 = pfVar13[-0x42];
          fVar53 = pfVar13[-0x41];
          fVar55 = pfVar13[-0x3f];
          fVar57 = pfVar13[-0x3e];
          fVar59 = pfVar13[-0x3d];
          pfVar19 = (float *)((long)pfVar23 + lVar22 + 0x90);
          *pfVar19 = pfVar13[-0x44] + pfVar13[-0x40];
          pfVar19[1] = fVar50 + fVar55;
          pfVar19[2] = fVar51 + fVar57;
          pfVar19[3] = fVar53 + fVar59;
          fVar50 = pfVar13[-0x1f];
          fVar51 = pfVar13[-0x1e];
          fVar53 = pfVar13[-0x1d];
          pfVar19 = (float *)((long)pfVar23 + lVar22 + 0xd8);
          *pfVar19 = fVar45 + fVar41 + pfVar13[-0x20];
          pfVar19[1] = fVar67 + fVar43 + fVar50;
          pfVar19[2] = fVar52 + fVar47 + fVar51;
          pfVar19[3] = fVar39 + fVar49 + fVar53;
          pfVar13 = pfVar13 + 4;
        }
        *(undefined8 *)(pfVar23 + 0x1f8) = local_1c8;
        *(undefined8 *)(pfVar23 + 0x1fa) = uStack_1c0;
        pfVar23[0x20a] = local_138[0x1c] + local_138[0x3c];
        pfVar23[0x20b] = local_138[0x1d] + local_138[0x3d];
        pfVar23[0x20c] = local_138[0x1e] + local_138[0x3e];
        pfVar23[0x20d] = local_138[0x1f] + local_138[0x3f];
        *(undefined8 *)(pfVar23 + 0x21c) = local_148;
        *(undefined8 *)(pfVar23 + 0x21e) = uStack_140;
        pfVar23[0x22e] = local_138[0x3c];
        pfVar23[0x22f] = local_138[0x3d];
        pfVar23[0x230] = local_138[0x3e];
        pfVar23[0x231] = local_138[0x3f];
      }
      pfVar11 = pfVar11 + 4;
      pfVar23 = pfVar23 + 4;
    }
    pfVar5 = pfVar5 + 0x240;
    pfVar7 = pfVar7 + 0x240;
  }
  memcpy(lins,qmf_state,0xf00);
  lVar9 = (long)((nch + -1) * 0x240);
  lVar10 = (long)(nch + -1);
  lVar6 = (long)(nch << 5);
  lVar4 = (long)nch;
  local_2a0 = lVar4 * 0x7e;
  lVar21 = lVar6 * 4;
  lVar22 = lVar4 * 2;
  local_2a8 = local_2a0 + lVar10 * 2;
  local_2b0 = lVar4 * 0x42;
  local_2b8 = local_2b0 + lVar10 * 2;
  local_2c0 = lVar4 * 0x3e;
  local_2c8 = local_2c0 + lVar10 * 2;
  local_2d0 = lVar10 * 2 + lVar4 * 2;
  local_2d8 = grbuf + 0x10f;
  local_2e0 = lins + 0x439;
  local_2e8 = grbuf + 0x133;
  local_2f0 = lVar22;
  for (lVar24 = 0; lVar24 < nbands; lVar24 = lVar24 + 2) {
    pfVar5 = grbuf + lVar24;
    pcm_00 = pcm + lVar24 * lVar6;
    pfVar7 = lins + lVar24 * 0x40 + 0x3c;
    pfVar7[0x3c0] = pfVar5[0x120];
    pfVar7[0x3c1] = pfVar5[lVar9 + 0x120];
    pfVar7[0x3c2] = *pfVar5;
    pfVar7[0x3c3] = pfVar5[lVar9];
    pfVar7[0x400] = pfVar5[0x121];
    pfVar7[0x401] = pfVar5[lVar9 + 0x121];
    pfVar7[0x402] = pfVar5[1];
    pfVar7[0x403] = pfVar5[lVar9 + 1];
    ma_dr_mp3d_synth_pair(pcm_00 + lVar10,nch,lins + lVar24 * 0x40 + 0x3d);
    ma_dr_mp3d_synth_pair(pcm_00 + lVar10 + lVar6,nch,lins + lVar24 * 0x40 + 0x7d);
    ma_dr_mp3d_synth_pair(pcm_00,nch,pfVar7);
    ma_dr_mp3d_synth_pair(pcm_00 + lVar6,nch,lins + lVar24 * 0x40 + 0x7c);
    auVar3 = _DAT_00194660;
    auVar2 = _DAT_001944e0;
    local_318 = local_2d0;
    local_278 = local_2f0;
    local_280 = local_2c8;
    local_288 = local_2c0;
    pfVar23 = (float *)&ma_dr_mp3d_synth(float*,short*,int,float*)::g_win;
    pfVar5 = local_2e8;
    pfVar7 = local_2e0;
    pfVar11 = local_2d8;
    lVar12 = local_2b0;
    lVar15 = local_2a0;
    lVar17 = local_2b8;
    lVar20 = local_2a8;
    for (lVar14 = 0xe; -1 < lVar14; lVar14 = lVar14 + -1) {
      pfVar7[-0x41] = pfVar5[-1];
      pfVar7[-0x40] = pfVar5[lVar9 + -1];
      pfVar7[-0x3f] = *pfVar5;
      pfVar7[-0x3e] = pfVar5[lVar9];
      pfVar7[-1] = *pfVar11;
      *pfVar7 = pfVar11[lVar9];
      pfVar7[-0x7f] = pfVar11[-1];
      pfVar7[-0x7e] = pfVar11[lVar9 + -1];
      fVar26 = *pfVar23;
      fVar30 = pfVar23[1];
      fVar31 = pfVar23[2];
      fVar32 = pfVar23[3];
      fVar45 = pfVar23[4];
      fVar67 = pfVar23[5];
      fVar52 = pfVar23[6];
      fVar39 = pfVar23[7];
      fVar41 = pfVar23[8];
      fVar43 = pfVar23[9];
      fVar47 = pfVar23[10];
      fVar49 = pfVar23[0xb];
      fVar50 = pfVar23[0xc];
      fVar51 = pfVar23[0xd];
      fVar53 = pfVar23[0xe];
      fVar55 = pfVar23[0xf];
      auVar25._0_4_ =
           fVar53 * pfVar7[-0x241] + pfVar7[-0x201] * fVar55 +
           fVar50 * pfVar7[-0x281] + pfVar7[-0x1c1] * fVar51 +
           fVar47 * pfVar7[-0x2c1] + pfVar7[-0x181] * fVar49 +
           fVar41 * pfVar7[-0x301] + pfVar7[-0x141] * fVar43 +
           fVar52 * pfVar7[-0x341] + pfVar7[-0x101] * fVar39 +
           fVar45 * pfVar7[-0x381] + pfVar7[-0xc1] * fVar67 +
           fVar31 * pfVar7[-0x3c1] + pfVar7[-0x81] * fVar32 +
           fVar26 * pfVar7[-0x401] + pfVar7[-0x41] * fVar30;
      auVar25._4_4_ =
           fVar53 * pfVar7[-0x240] + pfVar7[-0x200] * fVar55 +
           fVar50 * pfVar7[-0x280] + pfVar7[-0x1c0] * fVar51 +
           fVar47 * pfVar7[-0x2c0] + pfVar7[-0x180] * fVar49 +
           fVar41 * pfVar7[-0x300] + pfVar7[-0x140] * fVar43 +
           fVar52 * pfVar7[-0x340] + pfVar7[-0x100] * fVar39 +
           fVar45 * pfVar7[-0x380] + pfVar7[-0xc0] * fVar67 +
           fVar31 * pfVar7[-0x3c0] + pfVar7[-0x80] * fVar32 +
           fVar26 * pfVar7[-0x400] + pfVar7[-0x40] * fVar30;
      auVar25._8_4_ =
           fVar53 * pfVar7[-0x23f] + pfVar7[-0x1ff] * fVar55 +
           fVar50 * pfVar7[-0x27f] + pfVar7[-0x1bf] * fVar51 +
           fVar47 * pfVar7[-0x2bf] + pfVar7[-0x17f] * fVar49 +
           fVar41 * pfVar7[-0x2ff] + pfVar7[-0x13f] * fVar43 +
           fVar52 * pfVar7[-0x33f] + pfVar7[-0xff] * fVar39 +
           fVar45 * pfVar7[-0x37f] + pfVar7[-0xbf] * fVar67 +
           fVar31 * pfVar7[-0x3bf] + pfVar7[-0x7f] * fVar32 +
           fVar26 * pfVar7[-0x3ff] + pfVar7[-0x3f] * fVar30;
      auVar25._12_4_ =
           fVar53 * pfVar7[-0x23e] + pfVar7[-0x1fe] * fVar55 +
           fVar50 * pfVar7[-0x27e] + pfVar7[-0x1be] * fVar51 +
           fVar47 * pfVar7[-0x2be] + pfVar7[-0x17e] * fVar49 +
           fVar41 * pfVar7[-0x2fe] + pfVar7[-0x13e] * fVar43 +
           fVar52 * pfVar7[-0x33e] + pfVar7[-0xfe] * fVar39 +
           fVar45 * pfVar7[-0x37e] + pfVar7[-0xbe] * fVar67 +
           fVar31 * pfVar7[-0x3be] + pfVar7[-0x7e] * fVar32 +
           fVar26 * pfVar7[-0x3fe] + pfVar7[-0x3e] * fVar30;
      auVar27._0_4_ =
           (fVar55 * pfVar7[-0x241] - pfVar7[-0x201] * fVar53) +
           (pfVar7[-0x1c1] * fVar50 - fVar51 * pfVar7[-0x281]) +
           (fVar49 * pfVar7[-0x2c1] - pfVar7[-0x181] * fVar47) +
           (pfVar7[-0x141] * fVar41 - fVar43 * pfVar7[-0x301]) +
           (fVar39 * pfVar7[-0x341] - pfVar7[-0x101] * fVar52) +
           (pfVar7[-0xc1] * fVar45 - fVar67 * pfVar7[-0x381]) +
           (fVar32 * pfVar7[-0x3c1] - pfVar7[-0x81] * fVar31) +
           (pfVar7[-0x41] * fVar26 - fVar30 * pfVar7[-0x401]);
      auVar27._4_4_ =
           (fVar55 * pfVar7[-0x240] - pfVar7[-0x200] * fVar53) +
           (pfVar7[-0x1c0] * fVar50 - fVar51 * pfVar7[-0x280]) +
           (fVar49 * pfVar7[-0x2c0] - pfVar7[-0x180] * fVar47) +
           (pfVar7[-0x140] * fVar41 - fVar43 * pfVar7[-0x300]) +
           (fVar39 * pfVar7[-0x340] - pfVar7[-0x100] * fVar52) +
           (pfVar7[-0xc0] * fVar45 - fVar67 * pfVar7[-0x380]) +
           (fVar32 * pfVar7[-0x3c0] - pfVar7[-0x80] * fVar31) +
           (pfVar7[-0x40] * fVar26 - fVar30 * pfVar7[-0x400]);
      auVar27._8_4_ =
           (fVar55 * pfVar7[-0x23f] - pfVar7[-0x1ff] * fVar53) +
           (pfVar7[-0x1bf] * fVar50 - fVar51 * pfVar7[-0x27f]) +
           (fVar49 * pfVar7[-0x2bf] - pfVar7[-0x17f] * fVar47) +
           (pfVar7[-0x13f] * fVar41 - fVar43 * pfVar7[-0x2ff]) +
           (fVar39 * pfVar7[-0x33f] - pfVar7[-0xff] * fVar52) +
           (pfVar7[-0xbf] * fVar45 - fVar67 * pfVar7[-0x37f]) +
           (fVar32 * pfVar7[-0x3bf] - pfVar7[-0x7f] * fVar31) +
           (pfVar7[-0x3f] * fVar26 - fVar30 * pfVar7[-0x3ff]);
      auVar27._12_4_ =
           (fVar55 * pfVar7[-0x23e] - pfVar7[-0x1fe] * fVar53) +
           (pfVar7[-0x1be] * fVar50 - fVar51 * pfVar7[-0x27e]) +
           (fVar49 * pfVar7[-0x2be] - pfVar7[-0x17e] * fVar47) +
           (pfVar7[-0x13e] * fVar41 - fVar43 * pfVar7[-0x2fe]) +
           (fVar39 * pfVar7[-0x33e] - pfVar7[-0xfe] * fVar52) +
           (pfVar7[-0xbe] * fVar45 - fVar67 * pfVar7[-0x37e]) +
           (fVar32 * pfVar7[-0x3be] - pfVar7[-0x7e] * fVar31) +
           (pfVar7[-0x3e] * fVar26 - fVar30 * pfVar7[-0x3fe]);
      auVar28 = minps(auVar27,auVar2);
      auVar28 = maxps(auVar28,auVar3);
      auVar29._0_4_ = (int)auVar28._0_4_;
      auVar29._4_4_ = (int)auVar28._4_4_;
      auVar29._8_4_ = (int)auVar28._8_4_;
      auVar29._12_4_ = (int)auVar28._12_4_;
      auVar25 = minps(auVar25,auVar2);
      auVar25 = maxps(auVar25,auVar3);
      auVar28._0_4_ = (int)auVar25._0_4_;
      auVar28._4_4_ = (int)auVar25._4_4_;
      auVar28._8_4_ = (int)auVar25._8_4_;
      auVar28._12_4_ = (int)auVar25._12_4_;
      auVar25 = packssdw(auVar29,auVar28);
      *(short *)((long)pcm + local_318) = auVar25._2_2_;
      *(short *)((long)pcm + local_280) = auVar25._10_2_;
      *(short *)((long)pcm + local_278) = auVar25._0_2_;
      *(short *)((long)pcm + local_288) = auVar25._8_2_;
      *(short *)((long)pcm + lVar17) = auVar25._6_2_;
      *(short *)((long)pcm + lVar20) = auVar25._14_2_;
      *(short *)((long)pcm + lVar12) = auVar25._4_2_;
      *(short *)((long)pcm + lVar15) = auVar25._12_2_;
      lVar15 = lVar15 + lVar4 * -2;
      lVar20 = lVar20 + lVar4 * -2;
      lVar12 = lVar12 + lVar22;
      lVar17 = lVar17 + lVar22;
      local_288 = local_288 + lVar4 * -2;
      local_280 = local_280 + lVar4 * -2;
      local_278 = local_278 + lVar22;
      local_318 = local_318 + lVar22;
      pfVar11 = pfVar11 + -0x12;
      pfVar7 = pfVar7 + -4;
      pfVar5 = pfVar5 + 0x12;
      pfVar23 = pfVar23 + 0x10;
    }
    local_2a0 = local_2a0 + lVar21;
    local_2a8 = local_2a8 + lVar21;
    local_2b0 = local_2b0 + lVar21;
    local_2b8 = local_2b8 + lVar21;
    local_2c0 = local_2c0 + lVar21;
    local_2c8 = local_2c8 + lVar21;
    local_2f0 = local_2f0 + lVar21;
    local_2d0 = local_2d0 + lVar21;
    local_2d8 = local_2d8 + 2;
    local_2e0 = local_2e0 + 0x80;
    local_2e8 = local_2e8 + 2;
  }
  if (nch == 1) {
    for (uVar8 = 0; uVar8 < 0x3c0; uVar8 = uVar8 + 2) {
      qmf_state[uVar8] = (lins + (uint)(nbands << 6))[uVar8];
    }
    return;
  }
  memcpy(qmf_state,lins + (uint)(nbands << 6),0xf00);
  return;
}

Assistant:

static void ma_dr_mp3d_synth_granule(float *qmf_state, float *grbuf, int nbands, int nch, ma_dr_mp3d_sample_t *pcm, float *lins)
{
    int i;
    for (i = 0; i < nch; i++)
    {
        ma_dr_mp3d_DCT_II(grbuf + 576*i, nbands);
    }
    MA_DR_MP3_COPY_MEMORY(lins, qmf_state, sizeof(float)*15*64);
    for (i = 0; i < nbands; i += 2)
    {
        ma_dr_mp3d_synth(grbuf + i, pcm + 32*nch*i, nch, lins + i*64);
    }
#ifndef MA_DR_MP3_NONSTANDARD_BUT_LOGICAL
    if (nch == 1)
    {
        for (i = 0; i < 15*64; i += 2)
        {
            qmf_state[i] = lins[nbands*64 + i];
        }
    } else
#endif
    {
        MA_DR_MP3_COPY_MEMORY(qmf_state, lins + nbands*64, sizeof(float)*15*64);
    }
}